

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException
          (JsonRpcException *this,int code,string *message,json *data)

{
  string_t local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  json *local_28;
  json *data_local;
  string *message_local;
  JsonRpcException *pJStack_10;
  int code_local;
  JsonRpcException *this_local;
  
  local_28 = data;
  data_local = (json *)message;
  message_local._4_4_ = code;
  pJStack_10 = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__JsonRpcException_00240800;
  this->code = message_local._4_4_;
  std::__cxx11::string::string((string *)&this->message,(string *)data_local);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->data,local_28);
  std::__cxx11::to_string(&local_a8,message_local._4_4_);
  std::operator+(&local_88,&local_a8,": ");
  std::operator+(&local_68,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data_local);
  std::operator+(&local_48,&local_68,", data: ");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_c8,local_28,-1,' ',false,strict);
  std::operator+(&this->err,&local_48,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message, const json &data) noexcept
        : code(code), message(message), data(data), err(std::to_string(code) + ": " + message + ", data: " + data.dump()) {}